

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O0

DimensionEstimate *
ZXing::QRCode::EstimateDimension(BitMatrix *image,ConcentricPattern a,ConcentricPattern b)

{
  PointT<double> b_00;
  PointT<double> a_00;
  ConcentricPattern a_01;
  ConcentricPattern a_02;
  ConcentricPattern b_01;
  ConcentricPattern b_02;
  int iVar1;
  int iVar2;
  double in_RSI;
  DimensionEstimate *in_RDI;
  double dVar3;
  double dVar4;
  undefined8 unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  BitMatrix *in_stack_00000028;
  double in_stack_00000030;
  int error;
  int dimension;
  double moduleSize;
  double ms_b;
  double ms_a;
  long local_90 [2];
  double local_80;
  double local_48;
  double dVar5;
  undefined8 in_stack_fffffffffffffff0;
  
  a_01.super_PointF.y = in_stack_00000018;
  a_01.super_PointF.x = in_stack_00000010;
  a_01._16_8_ = in_stack_fffffffffffffff0;
  b_01._16_8_ = in_stack_00000008;
  b_01.super_PointF.y = (double)unaff_retaddr;
  b_01.super_PointF.x = in_RSI;
  dVar4 = in_stack_00000010;
  dVar5 = in_stack_00000018;
  dVar3 = EstimateModuleSize(in_stack_00000028,a_01,b_01);
  a_02.super_PointF.y = dVar5;
  a_02.super_PointF.x = dVar4;
  a_02._16_8_ = dVar3;
  b_02._16_8_ = in_stack_00000008;
  b_02.super_PointF.y = (double)unaff_retaddr;
  b_02.super_PointF.x = in_RSI;
  local_48 = EstimateModuleSize(in_stack_00000028,a_02,b_02);
  if ((dVar3 < 0.0) || (local_48 < 0.0)) {
    in_RDI->dim = 0;
    in_RDI->ms = 0.0;
    in_RDI->err = 4;
  }
  else {
    local_80 = (dVar3 + local_48) / 2.0;
    a_00.y = in_stack_00000018;
    a_00.x = in_stack_00000010;
    b_00.y = in_stack_00000008;
    b_00.x = in_stack_00000030;
    dVar4 = distance<double>(a_00,b_00);
    local_90[0] = lround(dVar4 / local_80);
    local_90[0] = local_90[0] + 7;
    iVar1 = narrow_cast<int,long>(local_90);
    iVar2 = 1 - iVar1 % 4;
    in_RDI->dim = iVar1 + iVar2;
    in_RDI->ms = local_80;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    in_RDI->err = iVar2;
  }
  return in_RDI;
}

Assistant:

static DimensionEstimate EstimateDimension(const BitMatrix& image, ConcentricPattern a, ConcentricPattern b)
{
	auto ms_a = EstimateModuleSize(image, a, b);
	auto ms_b = EstimateModuleSize(image, b, a);

	if (ms_a < 0 || ms_b < 0)
		return {};

	auto moduleSize = (ms_a + ms_b) / 2;

	int dimension = narrow_cast<int>(std::lround(distance(a, b) / moduleSize) + 7);
	int error     = 1 - (dimension % 4);

	return {dimension + error, moduleSize, std::abs(error)};
}